

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_candlestick.c
# Opt level: O0

ErrorNumber test_candlestick(TA_History *history)

{
  ErrorNumber EVar1;
  ErrorNumber retValue;
  uint i;
  TA_Test *in_stack_00000020;
  TA_History *in_stack_00000028;
  uint local_14;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,20000);
  local_14 = 0;
  while( true ) {
    if (0x3c < local_14) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
    EVar1 = do_test(in_stack_00000028,in_stack_00000020);
    if (EVar1 != TA_TEST_PASS) break;
    local_14 = local_14 + 1;
  }
  printf("Failed Test #%d for %s (retValue=%d)\n",(ulong)local_14,tableTest[local_14].name,
         (ulong)EVar1);
  return EVar1;
}

Assistant:

ErrorNumber test_candlestick( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Initialize all the unstable period with a large number that would
    * break the logic if a candlestick unexpectably use a function affected
    * by an unstable period.
    */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 20000 );

   /* Perform sequentialy all the tests. */
   for( i=0; i < NB_TEST; i++ )
   {
      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "Failed Test #%d for %s (retValue=%d)\n", i, tableTest[i].name, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All tests succeed. */
   return TA_TEST_PASS;
}